

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,vector_bagwell<unsigned_char_*,_16U> *bucket,
          size_t depth)

{
  pointer pppuVar1;
  uint uVar2;
  TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *this_00;
  ulong uVar3;
  uchar *puVar4;
  vector_bagwell<unsigned_char_*,_16U> *pvVar5;
  ulong uVar6;
  uint j;
  long lVar7;
  uchar **t;
  size_t index;
  array<unsigned_char,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  byte abStack_270 [64];
  uchar *local_230 [64];
  
  this_00 = (TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bucket->_insertpos != (uchar **)0x0) {
    pppuVar1 = (bucket->_index_block).
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar3 = (ulong)((long)bucket->_insertpos +
                   ((long)((1 << ((char)((uint)((int)pppuVar1 -
                                               *(int *)&(bucket->_index_block).
                                                                                                                
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                  3U & 0x1f)) + -0x10) * 8 - (long)pppuVar1[-1])) >> 3;
    uVar6 = 0;
    uVar2 = (uint)uVar3;
    if (0x3f < uVar2) {
      uVar6 = 0;
      do {
        lVar7 = 0;
        do {
          puVar4 = vector_bagwell<unsigned_char_*,_16U>::operator[](bucket,lVar7 + uVar6);
          local_230[lVar7] = puVar4;
          if (puVar4 == (uchar *)0x0) goto LAB_002125ee;
          abStack_270[lVar7] = puVar4[depth];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x40);
        t = local_230;
        lVar7 = 0;
        do {
          pvVar5 = TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_>::get_bucket
                             (this_00,(uint)abStack_270[lVar7]);
          if (pvVar5 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
            __assert_fail("sub_bucket",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0x78,
                          "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = vector_bagwell<unsigned char *>]"
                         );
          }
          vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar5,t);
          lVar7 = lVar7 + 1;
          t = t + 1;
        } while (lVar7 != 0x40);
        uVar6 = uVar6 + 0x40;
      } while (uVar6 < (uVar2 & 0xffffffc0));
    }
    if ((uint)uVar6 < uVar2) {
      index = uVar6 & 0xffffffff;
      do {
        local_230[0] = vector_bagwell<unsigned_char_*,_16U>::operator[](bucket,index);
        if (local_230[0] == (uchar *)0x0) {
LAB_002125ee:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x26,"unsigned char get_char(unsigned char *, size_t)");
        }
        pvVar5 = TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_>::get_bucket
                           (this_00,(uint)local_230[0][depth]);
        if (pvVar5 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
          __assert_fail("sub_bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x80,
                        "TrieNode<CharT, BucketT> *BurstSimple<unsigned char>::operator()(const BucketT &, size_t) const [CharT = unsigned char, BucketT = vector_bagwell<unsigned char *>]"
                       );
        }
        vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar5,local_230);
        index = index + 1;
      } while ((uVar3 & 0xffffffff) != index);
    }
  }
  return this_00;
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}